

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

int sx_vsnprintf(char *str,int size,char *fmt,__va_list_tag *args)

{
  int iVar1;
  __va_list_tag *args_local;
  char *fmt_local;
  int size_local;
  char *str_local;
  
  iVar1 = stbsp_vsnprintf(str,size,fmt,args);
  return iVar1;
}

Assistant:

int sx_vsnprintf(char* str, int size, const char* fmt, va_list args)
{
    return stbsp_vsnprintf(str, size, fmt, args);
}